

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3PendingTermsClear(Fts3Table *p)

{
  Fts3Index *pFVar1;
  PendingList *pList;
  Fts3Hash *pHash;
  Fts3HashElem *pElem;
  int i;
  Fts3Table *p_local;
  
  for (pElem._4_4_ = 0; pElem._4_4_ < p->nIndex; pElem._4_4_ = pElem._4_4_ + 1) {
    pFVar1 = p->aIndex;
    for (pHash = (Fts3Hash *)pFVar1[pElem._4_4_].hPending.first; pHash != (Fts3Hash *)0x0;
        pHash = *(Fts3Hash **)pHash) {
      fts3PendingListDelete(*(PendingList **)&pHash->htsize);
    }
    sqlite3Fts3HashClear(&pFVar1[pElem._4_4_].hPending);
  }
  p->nPendingData = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3PendingTermsClear(Fts3Table *p){
  int i;
  for(i=0; i<p->nIndex; i++){
    Fts3HashElem *pElem;
    Fts3Hash *pHash = &p->aIndex[i].hPending;
    for(pElem=fts3HashFirst(pHash); pElem; pElem=fts3HashNext(pElem)){
      PendingList *pList = (PendingList *)fts3HashData(pElem);
      fts3PendingListDelete(pList);
    }
    fts3HashClear(pHash);
  }
  p->nPendingData = 0;
}